

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Stats::getVectorAverage(Stats *this,int index)

{
  reference pvVar1;
  VectorAccumulator *this_00;
  int in_EDX;
  long in_RSI;
  Vector3d *in_RDI;
  Vector3d *value;
  ResultType *in_stack_ffffffffffffffb8;
  
  Vector3<double>::Vector3((Vector3<double> *)0x25089e);
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),(long)in_EDX);
  if (pvVar1->accumulator == (BaseAccumulator *)0x0) {
    this_00 = (VectorAccumulator *)0x0;
  }
  else {
    this_00 = (VectorAccumulator *)
              __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,
                             &VectorAccumulator::typeinfo,0);
  }
  VectorAccumulator::getAverage(this_00,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

Vector3d Stats::getVectorAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Vector3d value;
    dynamic_cast<VectorAccumulator*>(data_[index].accumulator)
        ->getAverage(value);
    return value;
  }